

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

void __thiscall AActor::AdjustFloorClip(AActor *this)

{
  double *pdVar1;
  int iVar2;
  sector_t *psVar3;
  player_t *ppVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  sector_t_conflict *psVar9;
  msecnode_t *pmVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double local_58;
  
  if (((this->flags3).Value & 0x20) == 0) {
    dVar12 = this->Floorclip;
    psVar3 = this->Sector;
    if (((psVar3->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) &&
       (((this->__Pos).Y * (psVar3->floorplane).normal.Y +
        (psVar3->floorplane).D + (this->__Pos).X * (psVar3->floorplane).normal.X) *
        (psVar3->floorplane).negiC < (this->__Pos).Z)) {
      this->Floorclip = 0.0;
    }
    pmVar10 = this->touching_sectorlist;
    if (pmVar10 == (msecnode_t *)0x0) {
      local_58 = 2147483647.0;
    }
    else {
      local_58 = 2147483647.0;
      do {
        iVar8 = this->Sector->PortalGroup;
        iVar2 = pmVar10->m_sector->PortalGroup;
        dVar11 = 0.0;
        dVar13 = 0.0;
        if (iVar8 != iVar2) {
          dVar11 = Displacements.data.Array[iVar2 * Displacements.size + iVar8].pos.X;
          dVar13 = Displacements.data.Array[iVar2 * Displacements.size + iVar8].pos.Y;
        }
        dVar5 = (this->__Pos).X;
        dVar6 = (this->__Pos).Y;
        psVar9 = sector_t::GetHeightSec(pmVar10->m_sector);
        dVar7 = local_58;
        if (psVar9 == (sector_t_conflict *)0x0) {
          psVar9 = pmVar10->m_sector;
          dVar11 = ((psVar9->floorplane).normal.Y * (dVar6 + dVar13) +
                   (psVar9->floorplane).D + (psVar9->floorplane).normal.X * (dVar5 + dVar11)) *
                   (psVar9->floorplane).negiC;
          pdVar1 = &(this->__Pos).Z;
          if ((dVar11 == *pdVar1) && (!NAN(dVar11) && !NAN(*pdVar1))) {
            iVar8 = sector_t::GetTerrain(psVar9,0);
            dVar7 = Terrains.Array[iVar8].FootClip;
            if (local_58 <= Terrains.Array[iVar8].FootClip) {
              dVar7 = local_58;
            }
          }
        }
        local_58 = dVar7;
        pmVar10 = pmVar10->m_tnext;
      } while (pmVar10 != (msecnode_t *)0x0);
    }
    local_58 = (double)(~-(ulong)(local_58 == 2147483647.0) & (ulong)local_58);
    this->Floorclip = local_58;
    ppVar4 = this->player;
    if ((ppVar4 != (player_t *)0x0) && (ppVar4->mo == (APlayerPawn *)this)) {
      if ((dVar12 != local_58) || (NAN(dVar12) || NAN(local_58))) {
        dVar12 = ppVar4->viewheight - (dVar12 - local_58);
        ppVar4->viewheight = dVar12;
        ppVar4->deltaviewheight =
             ((ppVar4->mo->ViewHeight + ppVar4->crouchviewdelta) - dVar12) * 0.125;
      }
    }
  }
  return;
}

Assistant:

void AActor::AdjustFloorClip ()
{
	if (flags3 & MF3_SPECIALFLOORCLIP)
	{
		return;
	}

	double oldclip = Floorclip;
	double shallowestclip = INT_MAX;
	const msecnode_t *m;

	// possibly standing on a 3D-floor
	if (Sector->e->XFloor.ffloors.Size() && Z() > Sector->floorplane.ZatPoint(this)) Floorclip = 0;

	// [RH] clip based on shallowest floor player is standing on
	// If the sector has a deep water effect, then let that effect
	// do the floorclipping instead of the terrain type.
	for (m = touching_sectorlist; m; m = m->m_tnext)
	{
		DVector3 pos = PosRelative(m->m_sector);
		sector_t *hsec = m->m_sector->GetHeightSec();
		if (hsec == NULL && m->m_sector->floorplane.ZatPoint (pos) == Z())
		{
			double clip = Terrains[m->m_sector->GetTerrain(sector_t::floor)].FootClip;
			if (clip < shallowestclip)
			{
				shallowestclip = clip;
			}
		}
	}
	if (shallowestclip == INT_MAX)
	{
		Floorclip = 0;
	}
	else
	{
		Floorclip = shallowestclip;
	}
	if (player && player->mo == this && oldclip != Floorclip)
	{
		player->viewheight -= (oldclip - Floorclip);
		player->deltaviewheight = player->GetDeltaViewHeight();
	}
}